

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::ImageInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,ImageInfiniteLight *this,Point2f u1
          ,Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar11;
  undefined1 auVar4 [16];
  undefined8 uVar12;
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar14 [64];
  undefined1 auVar17 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Vector3f VVar19;
  Vector3<float> z;
  Point3<float> PVar20;
  SampledSpectrum SVar21;
  Float mapPDF;
  Frame wFrame;
  Float local_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Tuple2<pbrt::Point2,_float> local_108;
  Tuple2<pbrt::Point2,_float> local_100;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Frame local_ec;
  LightLeSample local_c8;
  undefined1 extraout_var [56];
  undefined1 auVar13 [56];
  undefined1 auVar18 [56];
  
  local_c8.L.values.values[3] = local_c8.L.values.values[1];
  auVar14._8_56_ = in_register_00001248;
  auVar14._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_100 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6._0_16_);
  local_108 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14._0_16_);
  auVar7._0_8_ = PiecewiseConstant2D::Sample(&this->distribution,(Point2f *)&local_100,&local_16c);
  auVar17 = auVar14._4_60_;
  auVar7._8_56_ = extraout_var;
  local_118 = auVar7._0_16_;
  auVar13 = extraout_var;
  VVar19 = EqualAreaSquareToSphere(auVar7._0_8_);
  local_f8.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  local_f8._0_8_ = vmovlps_avx(auVar8._0_16_);
  z = Transform::operator()(&(this->super_LightBase).renderFromLight,(Vector3<float> *)&local_f8);
  auVar15._0_4_ = z.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._4_60_ = auVar17;
  auVar9._0_8_ = z.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar13;
  _local_148 = auVar9._0_16_;
  local_158 = auVar15._0_16_;
  local_128._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
  local_128._8_4_ = auVar13._0_4_ ^ 0x80000000;
  local_128._12_4_ = auVar13._4_4_ ^ 0x80000000;
  local_138 = -auVar15._0_4_;
  uStack_134 = auVar17._0_4_ ^ 0x80000000;
  uStack_130 = auVar17._4_4_ ^ 0x80000000;
  uStack_12c = auVar17._8_4_ ^ 0x80000000;
  Frame::FromZ(&local_ec,(Vector3f)z.super_Tuple3<pbrt::Vector3,_float>);
  VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       SampleUniformDiskConcentric((Point2f *)&local_108);
  local_168 = this->sceneRadius;
  VVar19.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  uVar11 = extraout_XMM0_Qb;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  VVar19 = Frame::FromLocal(&local_ec,VVar19);
  auVar4._0_4_ = local_168 * VVar19.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar4._4_4_ = fStack_164 * VVar19.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar4._8_4_ = fStack_160 * (float)uVar11;
  auVar4._12_4_ = fStack_15c * (float)((ulong)uVar11 >> 0x20);
  uVar12 = auVar4._8_8_;
  auVar18 = (undefined1  [56])0x0;
  uVar11 = vmovlps_avx(auVar4);
  local_c8.L.values.values[2] = local_168 * VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8.L.values.values[0] = (float)(int)uVar11;
  local_c8.L.values.values[1] = (float)(int)((ulong)uVar11 >> 0x20);
  PVar20 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_c8);
  fVar1 = this->sceneRadius;
  fVar3 = fVar1 * (float)local_158._0_4_;
  local_168 = PVar20.super_Tuple3<pbrt::Point3,_float>.x + fVar1 * (float)local_148._0_4_;
  fStack_164 = PVar20.super_Tuple3<pbrt::Point3,_float>.y + fVar1 * (float)local_148._4_4_;
  fStack_160 = (float)uVar12 + fVar1 * fStack_140;
  fStack_15c = (float)((ulong)uVar12 >> 0x20) + fVar1 * fStack_13c;
  _local_148 = ZEXT416((uint)(fVar1 * fVar1 * 3.1415927));
  auVar5._8_4_ = 0x3f800000;
  auVar5._0_8_ = 0x3f8000003f800000;
  auVar5._12_4_ = 0x3f800000;
  local_158 = vinsertps_avx(auVar5,ZEXT416((uint)local_16c),0x10);
  auVar13 = ZEXT856((ulong)local_118._8_8_);
  SVar21 = Le(this,(Point2f)local_118._0_8_,lambda);
  auVar16._0_8_ = SVar21.values.values._8_8_;
  auVar16._8_56_ = auVar18;
  auVar10._0_8_ = SVar21.values.values._0_8_;
  auVar10._8_56_ = auVar13;
  local_c8.L.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar16._0_16_);
  auVar2._4_4_ = fStack_164;
  auVar2._0_4_ = local_168;
  auVar2._8_4_ = fStack_160;
  auVar2._12_4_ = fStack_15c;
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2);
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(local_128);
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
  local_c8.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_c8.intr.set = false;
  auVar2 = vblendps_avx(_local_148,_DAT_00538250,0xe);
  auVar2 = vdivps_avx(local_158,auVar2);
  local_c8._144_8_ = vmovlps_avx(auVar2);
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar20.super_Tuple3<pbrt::Point3,_float>.z + fVar3;
  local_c8.ray.time = time;
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_c8);
  pstd::optional<pbrt::Interaction>::~optional(&local_c8.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> ImageInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                           SampledWavelengths &lambda,
                                                           Float time) const {
    // Sample infinite light image and compute ray direction _w_
    Float mapPDF;
    Point2f uv = distribution.Sample(u1, &mapPDF);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Vector3f w = -renderFromLight(wl);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute _ImageInfiniteLight_ ray PDFs
    Float pdfDir = mapPDF / (4 * Pi);
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));

    return LightLeSample(Le(uv, lambda), ray, pdfPos, pdfDir);
}